

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdIOCallback.cpp
# Opt level: O0

void __thiscall
libebml::StdIOCallback::setFilePointer(StdIOCallback *this,int64 Offset,seek_mode Mode)

{
  int iVar1;
  ostream *poVar2;
  CRTError *this_00;
  int *piVar3;
  uint64 uVar4;
  bool bVar5;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream Msg;
  seek_mode Mode_local;
  int64 Offset_local;
  StdIOCallback *this_local;
  
  if (this->File == (FILE *)0x0) {
    __assert_fail("File!=0",
                  "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/ebml/src/StdIOCallback.cpp"
                  ,0x73,"virtual void libebml::StdIOCallback::setFilePointer(int64, seek_mode)");
  }
  if (Offset < -0x8000000000000000) {
    __assert_fail("Offset >= LONG_MIN",
                  "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/ebml/src/StdIOCallback.cpp"
                  ,0x7d,"virtual void libebml::StdIOCallback::setFilePointer(int64, seek_mode)");
  }
  bVar5 = true;
  if ((Mode != seek_current) && (bVar5 = true, Mode != seek_end)) {
    bVar5 = Mode == seek_beginning;
  }
  if (!bVar5) {
    __assert_fail("Mode==SEEK_CUR||Mode==SEEK_END||Mode==SEEK_SET",
                  "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/ebml/src/StdIOCallback.cpp"
                  ,0x7f,"virtual void libebml::StdIOCallback::setFilePointer(int64, seek_mode)");
  }
  iVar1 = fseek((FILE *)this->File,Offset,Mode);
  if (iVar1 != 0) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar2 = std::operator<<((ostream *)local_198,"Failed to seek file ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->File);
    poVar2 = std::operator<<(poVar2," to offset ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,Offset);
    poVar2 = std::operator<<(poVar2," in mode ");
    std::ostream::operator<<(poVar2,Mode);
    this_00 = (CRTError *)__cxa_allocate_exception(0x18);
    std::__cxx11::ostringstream::str();
    piVar3 = __errno_location();
    CRTError::CRTError(this_00,&local_1c8,*piVar3);
    __cxa_throw(this_00,&CRTError::typeinfo,CRTError::~CRTError);
  }
  if (Mode == seek_beginning) {
    this->mCurrentPosition = Offset;
  }
  else if (Mode == seek_current) {
    this->mCurrentPosition = Offset + this->mCurrentPosition;
  }
  else if (Mode == seek_end) {
    uVar4 = ftell((FILE *)this->File);
    this->mCurrentPosition = uVar4;
  }
  return;
}

Assistant:

void StdIOCallback::setFilePointer(int64 Offset,seek_mode Mode)
{
  assert(File!=0);

  // There is a numeric cast in the boost library, which would be quite nice for this checking
  /*
    SL : replaced because unknown class in cygwin
    assert(Offset <= numeric_limits<long>::max());
    assert(Offset >= numeric_limits<long>::min());
  */

  assert(Offset <= LONG_MAX);
  assert(Offset >= LONG_MIN);

  assert(Mode==SEEK_CUR||Mode==SEEK_END||Mode==SEEK_SET);

  if(fseek(File,Offset,Mode)!=0) {
#if !defined(__GNUC__) || (__GNUC__ > 2)
    ostringstream Msg;
    Msg<<"Failed to seek file "<<File<<" to offset "<<(unsigned long)Offset<<" in mode "<<Mode;
    throw CRTError(Msg.str());
#else // GCC2
    mCurrentPosition = ftell(File);
#endif
  } else {
    switch ( Mode ) {
      case SEEK_CUR:
        mCurrentPosition += Offset;
        break;
      case SEEK_END:
        mCurrentPosition = ftell(File);
        break;
      case SEEK_SET:
        mCurrentPosition = Offset;
        break;
    }
  }
}